

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceId.h
# Opt level: O2

void __thiscall plugin::InterfaceId::InterfaceId(InterfaceId *this,string *name)

{
  runtime_error *this_00;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  if (name->_M_string_length != 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid IntefaceId, interface name cannot be empty.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit InterfaceId(const std::string& name)
            : m_name(name)
        {
            if(name.empty())
            {
                throw std::runtime_error("Invalid IntefaceId, interface name cannot be empty.");
            }
        }